

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void fill_MPP_FMT_RGB101010(RK_U8 *p,RK_U32 R,RK_U32 G,RK_U32 B,RK_U32 be)

{
  byte bVar1;
  byte bVar2;
  RK_U8 RVar3;
  int iVar5;
  int iVar6;
  int iVar7;
  RK_U32 val;
  RK_U32 be_local;
  RK_U32 B_local;
  RK_U32 G_local;
  RK_U32 R_local;
  RK_U8 *p_local;
  RK_U8 RVar4;
  
  iVar5 = (R & 0xff) << 0x16;
  iVar6 = (G & 0xff) << 0xc;
  bVar1 = (byte)((uint)iVar5 >> 0x10) | (byte)((uint)iVar6 >> 0x10);
  iVar7 = (B & 0xff) << 2;
  bVar2 = (byte)((uint)iVar6 >> 8) | (byte)((uint)iVar7 >> 8);
  RVar3 = (RK_U8)iVar7;
  RVar4 = (RK_U8)((uint)iVar5 >> 0x18);
  if (be == 0) {
    *p = RVar3;
    p[1] = bVar2;
    p[2] = bVar1;
    p[3] = RVar4;
  }
  else {
    *p = RVar4;
    p[1] = bVar1;
    p[2] = bVar2;
    p[3] = RVar3;
  }
  return;
}

Assistant:

static void fill_MPP_FMT_RGB101010(RK_U8 *p, RK_U32 R, RK_U32 G, RK_U32 B, RK_U32 be)
{
    // MPP_FMT_RGB101010
    // 32 bit pixel     MSB  -------->  LSB
    //                 (00rr,rrrr,rrrr,gggg,gggg,ggbb,bbbb,bbbb)
    // big    endian   |  byte 0 |  byte 1 |  byte 2 |  byte 3 |
    // little endian   |  byte 3 |  byte 2 |  byte 1 |  byte 0 |
    RK_U32 val = (((R * 4) & 0x3ff) << 20) |
                 (((G * 4) & 0x3ff) << 10) |
                 (((B * 4) & 0x3ff) <<  0);
    if (be) {
        p[0] = (val >> 24) & 0xff;
        p[1] = (val >> 16) & 0xff;
        p[2] = (val >>  8) & 0xff;
        p[3] = (val >>  0) & 0xff;
    } else {
        p[0] = (val >>  0) & 0xff;
        p[1] = (val >>  8) & 0xff;
        p[2] = (val >> 16) & 0xff;
        p[3] = (val >> 24) & 0xff;
    }
}